

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Slave *sp;
  int iVar1;
  Master m;
  Master local_48;
  
  local_48.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.slavepipes.
  super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.slavepipes.
  super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.slavepipes.
  super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = -4;
  do {
    sp = (Slave *)operator_new(4);
    sp->reg = 0;
    sp->addr = (char)iVar1 + '\x05';
    Master::add_slave(&local_48,sp);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0);
  Master::run(&local_48);
  if (local_48.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.slavepipes.
      super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.slavepipes.
                    super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.slavepipes.
                          super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.slavepipes.
                          super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv) {


	Master m;
	for (int i = 1; i < 5; ++i) {
		auto s = new Slave(i);
		m.add_slave(s);
	}
	m.run();
	return 0;
}